

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

shared_ptr<kratos::FinalStmtBlock> __thiscall kratos::Generator::final(Generator *this)

{
  size_type *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  shared_ptr<kratos::FinalStmtBlock> sVar3;
  shared_ptr<kratos::Stmt> local_38;
  undefined1 local_21;
  
  (this->super_IRNode)._vptr_IRNode = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::FinalStmtBlock,std::allocator<kratos::FinalStmtBlock>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_IRNode).fn_name_ln,
             (FinalStmtBlock **)this,(allocator<kratos::FinalStmtBlock> *)&local_21);
  std::__shared_ptr<kratos::FinalStmtBlock,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::FinalStmtBlock,kratos::FinalStmtBlock>
            ((__shared_ptr<kratos::FinalStmtBlock,(__gnu_cxx::_Lock_policy)2> *)this,
             (FinalStmtBlock *)(this->super_IRNode)._vptr_IRNode);
  local_38.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(this->super_IRNode)._vptr_IRNode;
  local_38.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (this->super_IRNode).fn_name_ln.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if ((pointer)local_38.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &(((pointer)
                 local_38.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->first)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &(((pointer)
                 local_38.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->first)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  (*((local_38.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_IRNode).
    _vptr_IRNode[7])();
  std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
  emplace_back<std::shared_ptr<kratos::Stmt>>
            ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>> *)
             (in_RSI + 0x1f8),&local_38);
  _Var2._M_pi = extraout_RDX;
  if ((pointer)local_38.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<kratos::FinalStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<kratos::FinalStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::FinalStmtBlock>)
         sVar3.super___shared_ptr<kratos::FinalStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FinalStmtBlock> Generator::final() {
    auto stmt = std::make_shared<FinalStmtBlock>();
    add_stmt(stmt);
    return stmt;
}